

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoods
          (BeagleCPUImpl<double,_1,_1> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  int *piVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  double *pdVar24;
  int j;
  long lVar25;
  int k;
  ulong uVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pdVar11 = this->gPartials[parIndex];
  pdVar12 = this->gTransitionMatrices[probIndex];
  pdVar13 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar14 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar15 = this->gTipStates[childIndex], piVar15 != (int *)0x0)) {
    uVar6 = this->kPatternCount;
    uVar7 = this->kCategoryCount;
    lVar23 = 0;
    for (uVar22 = 0; uVar22 != (~((int)uVar7 >> 0x1f) & uVar7); uVar22 = uVar22 + 1) {
      iVar8 = this->kMatrixSize;
      uVar9 = this->kStateCount;
      iVar19 = this->kPartialsPaddedStateCount;
      lVar23 = (long)(int)lVar23;
      lVar28 = 0;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pdVar13[uVar22];
      pdVar24 = pdVar11 + lVar23;
      for (uVar26 = 0; uVar26 != (~((int)uVar6 >> 0x1f) & uVar6); uVar26 = uVar26 + 1) {
        iVar10 = this->kTransPaddedStateCount;
        lVar28 = (long)(int)lVar28;
        pdVar18 = this->integrationTmp;
        pdVar17 = pdVar12 + (long)(iVar8 * (int)uVar22) + (long)piVar15[uVar26];
        for (uVar20 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar20; uVar20 = uVar20 + 1) {
          dVar30 = *pdVar17;
          pdVar17 = pdVar17 + iVar10;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pdVar18[lVar28 + uVar20];
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar30 * pdVar24[uVar20];
          auVar1 = vfmadd213sd_fma(auVar33,auVar31,auVar1);
          pdVar18[lVar28 + uVar20] = auVar1._0_8_;
        }
        lVar28 = lVar28 + uVar20;
        lVar23 = lVar23 + iVar19;
        pdVar24 = pdVar24 + iVar19;
      }
    }
  }
  else {
    pdVar24 = this->gPartials[childIndex];
    uVar6 = this->kStateCount;
    uVar7 = this->kPatternCount;
    uVar9 = this->kCategoryCount;
    lVar23 = 0;
    for (uVar22 = 0; uVar22 != (~((int)uVar9 >> 0x1f) & uVar9); uVar22 = uVar22 + 1) {
      lVar28 = (long)this->kPartialsPaddedStateCount;
      iVar8 = this->kMatrixSize;
      lVar23 = (long)(int)lVar23;
      lVar27 = 0;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = pdVar13[uVar22];
      pdVar17 = pdVar24 + lVar23 + 2;
      pdVar18 = pdVar24 + lVar23;
      for (uVar21 = 0; uVar21 != (~((int)uVar7 >> 0x1f) & uVar7); uVar21 = uVar21 + 1) {
        pdVar16 = this->integrationTmp;
        lVar27 = (long)(int)lVar27;
        uVar26 = 0;
        iVar19 = iVar8 * (int)uVar22;
        while (uVar26 != (~((int)uVar6 >> 0x1f) & uVar6)) {
          auVar31 = ZEXT816(0) << 0x40;
          pdVar29 = pdVar18;
          for (lVar25 = 0; auVar1 = auVar31, lVar25 < (int)uVar6 / 4 << 2; lVar25 = lVar25 + 4) {
            pdVar29 = pdVar29 + 4;
            auVar31 = vfmadd231pd_fma(auVar31,*(undefined1 (*) [16])(pdVar12 + iVar19 + lVar25),
                                      *(undefined1 (*) [16])(pdVar17 + lVar25 + -2));
            auVar31 = vfmadd231pd_fma(auVar31,*(undefined1 (*) [16])
                                               (pdVar12 + (long)iVar19 + lVar25 + 2),
                                      *(undefined1 (*) [16])(pdVar17 + lVar25));
          }
          while (lVar25 < (int)uVar6) {
            auVar37._8_8_ = 0;
            auVar37._0_8_ = pdVar12[iVar19 + lVar25];
            lVar25 = lVar25 + 1;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *pdVar29;
            auVar1 = vfmadd231sd_fma(auVar1,auVar37,auVar2);
            pdVar29 = pdVar29 + 1;
          }
          auVar31 = vshufpd_avx(auVar31,auVar31,1);
          iVar19 = iVar19 + uVar6 + 1;
          lVar25 = lVar23 + uVar26;
          uVar26 = uVar26 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar16[lVar27];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = (auVar31._0_8_ + auVar1._0_8_) * pdVar11[lVar25];
          auVar31 = vfmadd213sd_fma(auVar34,auVar32,auVar3);
          pdVar16[lVar27] = auVar31._0_8_;
          lVar27 = lVar27 + 1;
        }
        lVar23 = lVar23 + lVar28;
        pdVar17 = pdVar17 + lVar28;
        pdVar18 = pdVar18 + lVar28;
      }
    }
  }
  lVar23 = 0;
  for (lVar28 = 0; uVar6 = this->kPatternCount, lVar28 < (int)uVar6; lVar28 = lVar28 + 1) {
    auVar31 = ZEXT816(0) << 0x40;
    uVar22 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
    for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
      auVar35._8_8_ = 0;
      auVar35._0_8_ = pdVar14[uVar26];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->integrationTmp[(long)(int)lVar23 + uVar26];
      auVar31 = vfmadd231sd_fma(auVar31,auVar35,auVar4);
    }
    lVar23 = (long)(int)lVar23 + uVar22;
    dVar30 = log(auVar31._0_8_);
    this->outLogLikelihoodsTmp[lVar28] = dVar30;
  }
  if (scalingFactorsIndex == -1) {
    uVar22 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
  }
  else {
    pdVar11 = this->outLogLikelihoodsTmp;
    pdVar12 = this->gScaleBuffers[scalingFactorsIndex];
    uVar22 = (ulong)(~((int)uVar6 >> 0x1f) & uVar6);
    for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
      pdVar11[uVar26] = pdVar12[uVar26] + pdVar11[uVar26];
    }
  }
  *outSumLogLikelihood = 0.0;
  auVar31 = ZEXT816(0) << 0x40;
  pdVar11 = this->gPatternWeights;
  pdVar12 = this->outLogLikelihoodsTmp;
  for (uVar26 = 0; uVar22 != uVar26; uVar26 = uVar26 + 1) {
    auVar36._8_8_ = 0;
    auVar36._0_8_ = pdVar12[uVar26];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = pdVar11[uVar26];
    auVar31 = vfmadd231sd_fma(auVar31,auVar36,auVar5);
    *outSumLogLikelihood = auVar31._0_8_;
  }
  return (uint)!NAN(auVar31._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                     const int childIndex,
                                                     const int probIndex,
                                                     const int categoryWeightsIndex,
                                                     const int stateFrequenciesIndex,
                                                     const int scalingFactorsIndex,
                                                     double* outSumLogLikelihood) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));


    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;
        int stateCountModFour = (kStateCount / 4) * 4;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                const REALTYPE* partialsChildPtr = &partialsChild[v];
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJA = 0.0, sumOverJB = 0.0;
                    int j = 0;
                    const REALTYPE* transMatrixPtr = &transMatrix[w];
                    for (; j < stateCountModFour; j += 4) {
                        sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                        sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                        sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                        sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                    }
                    for (; j < kStateCount; j++) {
                        sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                    }
                    //                        for(int j = 0; j < kStateCount; j++) {
                    //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                    //                            w++;
                    //                        }
                    integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                    u++;

                    w += kStateCount;

                    // increment for the extra column at the end
                    w += T_PAD;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}